

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5SamplerArrayIndexing.cpp
# Opt level: O2

char * __thiscall
glcts::GPUShader5SamplerArrayIndexing::getVertexShaderCode(GPUShader5SamplerArrayIndexing *this)

{
  return 
  "${VERSION}\n\n${GPU_SHADER5_REQUIRE}\n\nprecision highp float;\n\nin vec4 position;\nvoid main()\n{\n   gl_Position = position;}\n"
  ;
}

Assistant:

const char* GPUShader5SamplerArrayIndexing::getVertexShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"${GPU_SHADER5_REQUIRE}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"in vec4 position;"
								"\n"
								"void main()\n"
								"{\n"
								"   gl_Position = position;"
								"}\n";

	return result;
}